

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O0

Allocation * __thiscall
density::detail::
LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
::external_allocate<(density::detail::LfQueue_ProgressGuarantee)0>
          (Allocation *__return_storage_ptr__,
          LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
          *this,uintptr_t i_control_bits,size_t i_size,size_t i_alignment)

{
  undefined1 local_50 [8];
  Allocation inplace_put;
  void *external_block;
  LfQueue_ProgressGuarantee guarantee;
  size_t i_alignment_local;
  size_t i_size_local;
  uintptr_t i_control_bits_local;
  LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  *this_local;
  
  inplace_put.m_user_storage =
       basic_default_allocator<65536UL>::allocate
                 ((basic_default_allocator<65536UL> *)this,i_size,i_alignment,0);
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0>
            ((Allocation *)local_50,
             (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
              *)this,i_control_bits | 4,true,0x18,8);
  if (inplace_put.m_next_ptr == 0) {
    basic_default_allocator<65536UL>::deallocate
              ((basic_default_allocator<65536UL> *)this,inplace_put.m_user_storage,i_size,
               i_alignment,0);
    Allocation::Allocation(__return_storage_ptr__);
  }
  else {
    *(void **)inplace_put.m_next_ptr = inplace_put.m_user_storage;
    *(size_t *)(inplace_put.m_next_ptr + 8) = i_size;
    *(size_t *)(inplace_put.m_next_ptr + 0x10) = i_alignment;
    Allocation::Allocation
              (__return_storage_ptr__,(LfQueueControl *)local_50,
               (uintptr_t)inplace_put.m_control_block,inplace_put.m_user_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

DENSITY_NO_INLINE Allocation external_allocate(
              uintptr_t i_control_bits,
              size_t    i_size,
              size_t    i_alignment) noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee = PROGRESS_GUARANTEE; // used to avoid warnings about
                                                     // constant conditional expressions
                DENSITY_ASSUME(guarantee == LfQueue_Throwing || guarantee == LfQueue_Blocking);

                void * external_block;
                if (guarantee == LfQueue_Throwing)
                {
                    external_block = ALLOCATOR_TYPE::allocate(i_size, i_alignment);
                }
                else
                {
                    external_block = ALLOCATOR_TYPE::try_allocate(i_size, i_alignment);
                    if (external_block == nullptr)
                    {
                        return Allocation{};
                    }
                }

                try
                {
                    /* external blocks always allocate space for the type, because it would be
                        complicated for the consumers to handle both cases */
                    auto const inplace_put =
                      static_cast<DERIVED *>(this)
                        ->template try_inplace_allocate_impl<PROGRESS_GUARANTEE>(
                          i_control_bits | LfQueue_External,
                          true,
                          sizeof(ExternalBlock),
                          alignof(ExternalBlock));
                    if (inplace_put.m_user_storage == nullptr)
                    {
                        ALLOCATOR_TYPE::deallocate(external_block, i_size, i_alignment);
                        return Allocation{};
                    }
                    new (inplace_put.m_user_storage)
                      ExternalBlock{external_block, i_size, i_alignment};
                    return Allocation{
                      inplace_put.m_control_block, inplace_put.m_next_ptr, external_block};
                }
                catch (...)
                {
                    /* if inplace_allocate fails, that means that we were able to allocate the
                        external block, but we were not able to put the struct ExternalBlock in
                        the page (because a new page was necessary, but we could not allocate
                        it). */
                    ALLOCATOR_TYPE::deallocate(external_block, i_size, i_alignment);
                    DENSITY_INTERNAL_RETHROW_FROM_NOEXCEPT;
                }
            }